

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcPrsMem::reset(CTcPrsMem *this,tcprsmem_state_t *state)

{
  tcprsmem_blk_t *ptVar1;
  tcprsmem_blk_t *ptVar2;
  
  ptVar2 = state->tail->next_;
  while (ptVar2 != (tcprsmem_blk_t *)0x0) {
    ptVar1 = ptVar2->next_;
    free(ptVar2);
    ptVar2 = ptVar1;
  }
  ptVar2 = state->tail;
  this->tail_ = ptVar2;
  ptVar2->next_ = (tcprsmem_blk_t *)0x0;
  this->free_ptr_ = state->free_ptr;
  this->rem_ = state->rem;
  return;
}

Assistant:

void CTcPrsMem::reset(const tcprsmem_state_t *state)
{
    tcprsmem_blk_t *cur;
    
    /* 
     *   delete all of the blocks that were allocated after the last block
     *   that existed when the state was saved 
     */
    for (cur = state->tail->next_ ; cur != 0 ; )
    {
        tcprsmem_blk_t *nxt;

        /* remember the next block */
        nxt = cur->next_;

        /* delete this block */
        t3free(cur);

        /* move on to the next one */
        cur = nxt;
    }

    /* re-establish the saved last block */
    tail_ = state->tail;

    /* make sure the list is terminated at the last block */
    tail_->next_ = 0;

    /* re-establish the saved allocation point in the last block */
    free_ptr_ = state->free_ptr;
    rem_ = state->rem;
}